

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlSplitQName(xmlParserCtxtPtr ctxt,xmlChar *name,xmlChar **prefixOut)

{
  byte bVar1;
  bool bVar2;
  uint val;
  int iVar3;
  xmlChar *pxVar4;
  int newSize_1;
  xmlChar *tmp_1;
  int local_d8;
  int first;
  int l;
  int newSize;
  xmlChar *tmp;
  byte *pbStack_c0;
  int c;
  xmlChar *cur;
  xmlChar *prefix;
  xmlChar *ret;
  int max;
  int len;
  xmlChar *buffer;
  xmlChar buf [105];
  xmlChar **prefixOut_local;
  xmlChar *name_local;
  xmlParserCtxtPtr ctxt_local;
  
  _max = (xmlChar *)0x0;
  ret._4_4_ = 0;
  ret._0_4_ = 100;
  prefix = (xmlChar *)0x0;
  if (prefixOut == (xmlChar **)0x0) {
    return (xmlChar *)0x0;
  }
  *prefixOut = (xmlChar *)0x0;
  if (name == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  unique0x100004d1 = prefixOut;
  if (*name == ':') {
    pbStack_c0 = name;
    pxVar4 = xmlStrdup(name);
    return pxVar4;
  }
  bVar1 = *name;
  pbStack_c0 = name + 1;
  while( true ) {
    tmp._4_4_ = (uint)bVar1;
    bVar2 = false;
    if ((tmp._4_4_ != 0) && (bVar2 = false, tmp._4_4_ != 0x3a)) {
      bVar2 = ret._4_4_ < 100;
    }
    if (!bVar2) break;
    buf[(long)ret._4_4_ + -8] = bVar1;
    bVar1 = *pbStack_c0;
    pbStack_c0 = pbStack_c0 + 1;
    ret._4_4_ = ret._4_4_ + 1;
  }
  if (99 < ret._4_4_) {
    ret._0_4_ = ret._4_4_ << 1;
    _max = (xmlChar *)(*xmlMalloc)((long)(int)ret);
    if (_max == (xmlChar *)0x0) {
      xmlErrMemory(ctxt);
      return (xmlChar *)0x0;
    }
    memcpy(_max,&buffer,(long)ret._4_4_);
    while (tmp._4_4_ != 0 && tmp._4_4_ != 0x3a) {
      if ((int)ret < ret._4_4_ + 10) {
        first = xmlGrowCapacity((int)ret,1,1,1000000000);
        if (first < 0) {
          xmlErrMemory(ctxt);
          (*xmlFree)(_max);
          return (xmlChar *)0x0;
        }
        _l = (xmlChar *)(*xmlRealloc)(_max,(long)first);
        if (_l == (xmlChar *)0x0) {
          xmlErrMemory(ctxt);
          (*xmlFree)(_max);
          return (xmlChar *)0x0;
        }
        ret._0_4_ = first;
        _max = _l;
      }
      _max[ret._4_4_] = (xmlChar)tmp._4_4_;
      tmp._4_4_ = (uint)*pbStack_c0;
      pbStack_c0 = pbStack_c0 + 1;
      ret._4_4_ = ret._4_4_ + 1;
    }
    _max[ret._4_4_] = '\0';
  }
  if ((tmp._4_4_ == 0x3a) && (*pbStack_c0 == 0)) {
    if (_max != (xmlChar *)0x0) {
      (*xmlFree)(_max);
    }
    pxVar4 = xmlStrdup(name);
    return pxVar4;
  }
  if (_max == (xmlChar *)0x0) {
    prefix = xmlStrndup((xmlChar *)&buffer,ret._4_4_);
    if (prefix == (xmlChar *)0x0) {
      xmlErrMemory(ctxt);
      return (xmlChar *)0x0;
    }
  }
  else {
    prefix = _max;
    _max = (xmlChar *)0x0;
    ret._0_4_ = 100;
  }
  if (tmp._4_4_ != 0x3a) {
    return prefix;
  }
  tmp._4_4_ = (uint)*pbStack_c0;
  cur = prefix;
  if (tmp._4_4_ == 0) {
    prefix = xmlStrndup("",0);
    if (prefix != (xmlChar *)0x0) {
      *stack0xffffffffffffffd8 = cur;
      return prefix;
    }
    (*xmlFree)(cur);
    return (xmlChar *)0x0;
  }
  ret._4_4_ = 0;
  if ((((tmp._4_4_ < 0x61) || (0x7a < tmp._4_4_)) && ((tmp._4_4_ < 0x41 || (0x5a < tmp._4_4_)))) &&
     ((tmp._4_4_ != 0x5f && (tmp._4_4_ != 0x3a)))) {
    val = xmlStringCurrentChar(ctxt,pbStack_c0,&local_d8);
    if ((int)val < 0x100) {
      if (((((0x40 < (int)val) && ((int)val < 0x5b)) || ((0x60 < (int)val && ((int)val < 0x7b)))) ||
          (((0xbf < (int)val && ((int)val < 0xd7)) || ((0xd7 < (int)val && ((int)val < 0xf7)))))) ||
         (0xf7 < (int)val)) goto LAB_0013954a;
    }
    else {
      iVar3 = xmlCharInRange(val,&xmlIsBaseCharGroup);
      if (iVar3 != 0) goto LAB_0013954a;
    }
    if ((((int)val < 0x100) ||
        (((((int)val < 0x4e00 || (0x9fa5 < (int)val)) && (val != 0x3007)) &&
         (((int)val < 0x3021 || (0x3029 < (int)val)))))) && (val != 0x5f)) {
      xmlFatalErrMsgStr(ctxt,XML_NS_ERR_QNAME,"Name %s is not XML Namespace compliant\n",name);
    }
  }
LAB_0013954a:
  while (pbStack_c0 = pbStack_c0 + 1, tmp._4_4_ != 0 && ret._4_4_ < (int)ret) {
    buf[(long)ret._4_4_ + -8] = (xmlChar)tmp._4_4_;
    ret._4_4_ = ret._4_4_ + 1;
    tmp._4_4_ = (uint)*pbStack_c0;
  }
  if ((int)ret <= ret._4_4_) {
    ret._0_4_ = ret._4_4_ << 1;
    _max = (xmlChar *)(*xmlMalloc)((long)(int)ret);
    if (_max == (xmlChar *)0x0) {
      xmlErrMemory(ctxt);
      (*xmlFree)(cur);
      return (xmlChar *)0x0;
    }
    memcpy(_max,&buffer,(long)ret._4_4_);
    while (tmp._4_4_ != 0) {
      iVar3 = (int)ret;
      pxVar4 = _max;
      if ((int)ret < ret._4_4_ + 10) {
        iVar3 = xmlGrowCapacity((int)ret,1,1,1000000000);
        if (iVar3 < 0) {
          xmlErrMemory(ctxt);
          (*xmlFree)(_max);
          return (xmlChar *)0x0;
        }
        pxVar4 = (xmlChar *)(*xmlRealloc)(_max,(long)iVar3);
        if (pxVar4 == (xmlChar *)0x0) {
          xmlErrMemory(ctxt);
          (*xmlFree)(cur);
          (*xmlFree)(_max);
          return (xmlChar *)0x0;
        }
      }
      _max = pxVar4;
      ret._0_4_ = iVar3;
      _max[ret._4_4_] = (xmlChar)tmp._4_4_;
      tmp._4_4_ = (uint)*pbStack_c0;
      pbStack_c0 = pbStack_c0 + 1;
      ret._4_4_ = ret._4_4_ + 1;
    }
    _max[ret._4_4_] = '\0';
  }
  if (_max == (xmlChar *)0x0) {
    prefix = xmlStrndup((xmlChar *)&buffer,ret._4_4_);
    if (prefix == (xmlChar *)0x0) {
      (*xmlFree)(cur);
      return (xmlChar *)0x0;
    }
  }
  else {
    prefix = _max;
  }
  *stack0xffffffffffffffd8 = cur;
  return prefix;
}

Assistant:

xmlChar *
xmlSplitQName(xmlParserCtxtPtr ctxt, const xmlChar *name, xmlChar **prefixOut) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *buffer = NULL;
    int len = 0;
    int max = XML_MAX_NAMELEN;
    xmlChar *ret = NULL;
    xmlChar *prefix;
    const xmlChar *cur = name;
    int c;

    if (prefixOut == NULL) return(NULL);
    *prefixOut = NULL;

    if (cur == NULL) return(NULL);

    /* nasty but well=formed */
    if (cur[0] == ':')
	return(xmlStrdup(name));

    c = *cur++;
    while ((c != 0) && (c != ':') && (len < max)) { /* tested bigname.xml */
	buf[len++] = c;
	c = *cur++;
    }
    if (len >= max) {
	/*
	 * Okay someone managed to make a huge name, so he's ready to pay
	 * for the processing speed.
	 */
	max = len * 2;

	buffer = xmlMalloc(max);
	if (buffer == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
	}
	memcpy(buffer, buf, len);
	while ((c != 0) && (c != ':')) { /* tested bigname.xml */
	    if (len + 10 > max) {
	        xmlChar *tmp;
                int newSize;

                newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_ITEMS);
                if (newSize < 0) {
		    xmlErrMemory(ctxt);
		    xmlFree(buffer);
		    return(NULL);
                }
		tmp = xmlRealloc(buffer, newSize);
		if (tmp == NULL) {
		    xmlErrMemory(ctxt);
		    xmlFree(buffer);
		    return(NULL);
		}
		buffer = tmp;
		max = newSize;
	    }
	    buffer[len++] = c;
	    c = *cur++;
	}
	buffer[len] = 0;
    }

    if ((c == ':') && (*cur == 0)) {
        if (buffer != NULL)
	    xmlFree(buffer);
	return(xmlStrdup(name));
    }

    if (buffer == NULL) {
	ret = xmlStrndup(buf, len);
        if (ret == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
        }
    } else {
	ret = buffer;
	buffer = NULL;
	max = XML_MAX_NAMELEN;
    }


    if (c == ':') {
	c = *cur;
        prefix = ret;
	if (c == 0) {
	    ret = xmlStrndup(BAD_CAST "", 0);
            if (ret == NULL) {
                xmlFree(prefix);
                return(NULL);
            }
            *prefixOut = prefix;
            return(ret);
	}
	len = 0;

	/*
	 * Check that the first character is proper to start
	 * a new name
	 */
	if (!(((c >= 0x61) && (c <= 0x7A)) ||
	      ((c >= 0x41) && (c <= 0x5A)) ||
	      (c == '_') || (c == ':'))) {
	    int l;
	    int first = CUR_SCHAR(cur, l);

	    if (!IS_LETTER(first) && (first != '_')) {
		xmlFatalErrMsgStr(ctxt, XML_NS_ERR_QNAME,
			    "Name %s is not XML Namespace compliant\n",
				  name);
	    }
	}
	cur++;

	while ((c != 0) && (len < max)) { /* tested bigname2.xml */
	    buf[len++] = c;
	    c = *cur++;
	}
	if (len >= max) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
                xmlFree(prefix);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (c != 0) { /* tested bigname2.xml */
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_ITEMS);
                    if (newSize < 0) {
                        xmlErrMemory(ctxt);
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
                        xmlFree(prefix);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		buffer[len++] = c;
		c = *cur++;
	    }
	    buffer[len] = 0;
	}

	if (buffer == NULL) {
	    ret = xmlStrndup(buf, len);
            if (ret == NULL) {
                xmlFree(prefix);
                return(NULL);
            }
	} else {
	    ret = buffer;
	}

        *prefixOut = prefix;
    }

    return(ret);
}